

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O0

Instr * __thiscall LowererMD::Simd128LowerStoreElem(LowererMD *this,Instr *instr)

{
  code *pcVar1;
  uint8 dataWidth_00;
  Opnd *src1_00;
  bool bVar2;
  BYTE scaleFactor;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar3;
  Opnd *this_01;
  IndirOpnd *pIVar4;
  RegOpnd *indexOpnd_00;
  RegOpnd *this_02;
  Instr *pIVar5;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  uint8 local_31;
  ValueType arrType;
  Opnd *pOStack_30;
  uint8 dataWidth;
  Opnd *src1;
  RegOpnd *indexOpnd;
  Opnd *dst;
  Instr *instr_local;
  LowererMD *this_local;
  
  this_00 = Func::GetJITFunctionBody(this->m_func);
  bVar2 = JITTimeFunctionBody::IsAsmJsMode(this_00);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xaf8,"(!m_func->GetJITFunctionBody()->IsAsmJsMode())",
                       "!m_func->GetJITFunctionBody()->IsAsmJsMode()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (((((instr->m_opcode != Simd128_StArr_I4) && (instr->m_opcode != Simd128_StArr_I8)) &&
       (instr->m_opcode != Simd128_StArr_I16)) &&
      ((instr->m_opcode != Simd128_StArr_U4 && (instr->m_opcode != Simd128_StArr_U8)))) &&
     ((instr->m_opcode != Simd128_StArr_U16 && (instr->m_opcode != Simd128_StArr_F4)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xb01,
                       "(instr->m_opcode == Js::OpCode::Simd128_StArr_I4 || instr->m_opcode == Js::OpCode::Simd128_StArr_I8 || instr->m_opcode == Js::OpCode::Simd128_StArr_I16 || instr->m_opcode == Js::OpCode::Simd128_StArr_U4 || instr->m_opcode == Js::OpCode::Simd128_StArr_U8 || instr->m_opcode == Js::OpCode::Simd128_StArr_U16 || instr->m_opcode == Js::OpCode::Simd128_StArr_F4)"
                       ,
                       "instr->m_opcode == Js::OpCode::Simd128_StArr_I4 || instr->m_opcode == Js::OpCode::Simd128_StArr_I8 || instr->m_opcode == Js::OpCode::Simd128_StArr_I16 || instr->m_opcode == Js::OpCode::Simd128_StArr_U4 || instr->m_opcode == Js::OpCode::Simd128_StArr_U8 || instr->m_opcode == Js::OpCode::Simd128_StArr_U16 || instr->m_opcode == Js::OpCode::Simd128_StArr_F4"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_01 = IR::Instr::GetDst(instr);
  pIVar4 = IR::Opnd::AsIndirOpnd(this_01);
  indexOpnd_00 = IR::IndirOpnd::GetIndexOpnd(pIVar4);
  pOStack_30 = IR::Instr::GetSrc1(instr);
  local_31 = instr->dataWidth;
  pIVar4 = IR::Opnd::AsIndirOpnd(this_01);
  this_02 = IR::IndirOpnd::GetBaseOpnd(pIVar4);
  local_34.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(&this_02->super_Opnd);
  bVar2 = ValueType::IsObject((ValueType *)&local_34.field_0);
  if ((!bVar2) || (bVar2 = ValueType::IsTypedArray((ValueType *)&local_34.field_0), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0xb0a,"(arrType.IsObject() && arrType.IsTypedArray())",
                       "arrType.IsObject() && arrType.IsTypedArray()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pIVar4 = IR::Opnd::AsIndirOpnd(this_01);
  Simd128GenerateUpperBoundCheck(this,indexOpnd_00,pIVar4,(ValueType)local_34.field_0,instr);
  pIVar4 = IR::Opnd::AsIndirOpnd(this_01);
  Simd128LoadHeadSegment(this,pIVar4,(ValueType)local_34.field_0,instr);
  src1_00 = pOStack_30;
  dataWidth_00 = local_31;
  scaleFactor = Lowerer::GetArrayIndirScale((ValueType)local_34.field_0);
  pIVar5 = Simd128ConvertToStore(this,this_01,src1_00,dataWidth_00,instr,scaleFactor);
  return pIVar5;
}

Assistant:

IR::Instr*
LowererMD::Simd128LowerStoreElem(IR::Instr *instr)
{
    Assert(!m_func->GetJITFunctionBody()->IsAsmJsMode());
    Assert(
           instr->m_opcode == Js::OpCode::Simd128_StArr_I4 ||
           instr->m_opcode == Js::OpCode::Simd128_StArr_I8 ||
           instr->m_opcode == Js::OpCode::Simd128_StArr_I16 ||
           instr->m_opcode == Js::OpCode::Simd128_StArr_U4 ||
           instr->m_opcode == Js::OpCode::Simd128_StArr_U8 ||
           instr->m_opcode == Js::OpCode::Simd128_StArr_U16 ||
           instr->m_opcode == Js::OpCode::Simd128_StArr_F4
        );

    IR::Opnd * dst = instr->GetDst();
    IR::RegOpnd * indexOpnd = dst->AsIndirOpnd()->GetIndexOpnd();
    IR::Opnd * src1 = instr->GetSrc1();
    uint8 dataWidth = instr->dataWidth;
    ValueType arrType = dst->AsIndirOpnd()->GetBaseOpnd()->GetValueType();

    // If we type-specialized, then array is a definite type-array.
    Assert(arrType.IsObject() && arrType.IsTypedArray());

    Simd128GenerateUpperBoundCheck(indexOpnd, dst->AsIndirOpnd(), arrType, instr);
    Simd128LoadHeadSegment(dst->AsIndirOpnd(), arrType, instr);
    return Simd128ConvertToStore(dst, src1, dataWidth, instr, m_lowerer->GetArrayIndirScale(arrType) /*scale factor*/);
}